

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O2

TLVWriter * __thiscall
ASDCP::MXF::TLVWriter::WriteUi16(TLVWriter *this,MDDEntry *Entry,ui16_t *value)

{
  bool bVar1;
  ui16_t *in_RCX;
  Result_t result;
  
  if (in_RCX == (ui16_t *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
    return this;
  }
  WriteTag((TLVWriter *)&result,Entry);
  if (-1 < _result) {
    bVar1 = Kumu::MemIOWriter::WriteUi16BE((MemIOWriter *)Entry,2);
    if (!bVar1) {
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_00194736;
    }
    bVar1 = Kumu::MemIOWriter::WriteUi16BE((MemIOWriter *)Entry,*in_RCX);
    if (!bVar1) {
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_00194736;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,&result);
LAB_00194736:
  Kumu::Result_t::~Result_t(&result);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVWriter::WriteUi16(const MDDEntry& Entry, ui16_t* value)
{
  ASDCP_TEST_NULL(value);
  Result_t result = WriteTag(Entry);

  if ( KM_SUCCESS(result) )
    {
      if ( ! MemIOWriter::WriteUi16BE(sizeof(ui16_t)) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
      if ( ! MemIOWriter::WriteUi16BE(*value) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
    }

  return result;
}